

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_hashmap.c
# Opt level: O1

int64_t SUNHashMap_GetValue(SUNHashMap map,char *key,void **value)

{
  SUNStlVector_SUNHashMapKeyValue pSVar1;
  void **ppvVar2;
  bool bVar3;
  int iVar4;
  int64_t iVar5;
  void **ppvVar6;
  char *pcVar7;
  void **ppvVar8;
  char cVar9;
  ulong uVar10;
  void **ppvVar11;
  SUNHashMapKeyValue *ppSVar12;
  
  iVar5 = -99;
  if (value != (void **)0x0 && (key != (char *)0x0 && map != (SUNHashMap)0x0)) {
    pSVar1 = map->buckets;
    ppvVar6 = (void **)pSVar1->capacity;
    if ((long)ppvVar6 - 1U == 0) {
      ppvVar8 = (void **)0x0;
    }
    else {
      uVar10 = 0x100000001b3;
      cVar9 = *key;
      if (cVar9 == '\0') {
        uVar10 = 0x100000001b3;
      }
      else {
        pcVar7 = key + 1;
        do {
          uVar10 = ((long)cVar9 ^ uVar10) * -0x340d631b7bdddcdb;
          cVar9 = *pcVar7;
          pcVar7 = pcVar7 + 1;
        } while (cVar9 != '\0');
      }
      ppvVar8 = (void **)(uVar10 % ((long)ppvVar6 - 1U));
    }
    ppvVar2 = (void **)pSVar1->size;
    if ((pSVar1->values[(long)ppvVar8] == (SUNHashMapKeyValue)0x0) ||
       (iVar4 = strcmp(pSVar1->values[(long)ppvVar8]->key,key), iVar4 != 0)) {
      ppvVar11 = (void **)((long)ppvVar8 + 1);
      bVar3 = (long)ppvVar11 < (long)ppvVar2;
      ppvVar8 = ppvVar6;
      if ((long)ppvVar11 < (long)ppvVar2) {
        ppSVar12 = pSVar1->values;
        do {
          if ((ppSVar12[(long)ppvVar11] == (SUNHashMapKeyValue)0x0) ||
             (iVar4 = strcmp(ppSVar12[(long)ppvVar11]->key,key), ppvVar6 = ppvVar11, iVar4 != 0)) {
            ppvVar6 = (void **)0xffffffffffffff9d;
          }
          if (ppvVar6 != (void **)0xffffffffffffff9d) break;
          ppvVar11 = (void **)((long)ppvVar11 + 1);
          bVar3 = (long)ppvVar11 < (long)ppvVar2;
          ppvVar6 = value;
        } while (ppvVar11 != ppvVar2);
        if (bVar3) {
          ppvVar8 = ppvVar6;
        }
      }
      if (ppvVar8 == (void **)0xffffffffffffff9d) {
        return -99;
      }
    }
    if ((long)ppvVar8 < 0 || (long)ppvVar2 <= (long)ppvVar8) {
      ppSVar12 = (SUNHashMapKeyValue *)0x0;
    }
    else {
      ppSVar12 = pSVar1->values + (long)ppvVar8;
    }
    if (ppSVar12 == (SUNHashMapKeyValue *)0x0) {
      iVar5 = -1;
    }
    else {
      *value = (*ppSVar12)->value;
      iVar5 = 0;
    }
  }
  return iVar5;
}

Assistant:

int64_t SUNHashMap_GetValue(SUNHashMap map, const char* key, void** value)
{
  int64_t idx;
  int64_t retval;
  sunbooleantype collision;

  if (map == NULL || key == NULL || value == NULL) { return SUNHASHMAP_ERROR; }

  idx = sunHashMapIdxFromKey(map, key);

  SUNHashMapKeyValue kvp = *SUNStlVector_SUNHashMapKeyValue_At(map->buckets, idx);

  /* Check for a collision (NULL kvp means there was a collision at one point, but
     the colliding key has since been removed)*/
  collision = kvp ? strcmp(kvp->key, key) : SUNTRUE;

  /* Resolve a collision via linear probing */
  if (collision)
  {
    retval = SUNHashMap_Iterate(map, idx + 1, sunHashMapLinearProbeGet, key);
    if (retval == SUNHASHMAP_ERROR)
    {
      /* the key was either not found anywhere or an error occurred */
      return retval;
    }
    else { idx = retval; }
  }

  /* Return a reference to the value only */
  SUNHashMapKeyValue* kvp_ptr = SUNStlVector_SUNHashMapKeyValue_At(map->buckets,
                                                                   idx);
  if (kvp_ptr) { *value = (*kvp_ptr)->value; }
  else { return SUNHASHMAP_KEYNOTFOUND; }

  return (0);
}